

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_memory.cpp
# Opt level: O1

void __thiscall LiteScript::_BasicMemory_1::FlagsErase(_BasicMemory_1 *this)

{
  uint uVar1;
  uint uVar2;
  _BasicMemory_0 *this_00;
  uint i;
  long lVar3;
  
  lVar3 = 0;
  do {
    this_00 = (this->arr)._M_elems[lVar3];
    if (this_00 != (_BasicMemory_0 *)0x0) {
      uVar1 = this_00->count;
      uVar2 = *this_00->Count;
      _BasicMemory_0::FlagsErase(this_00);
      if ((uVar1 == 0x100) && ((this->arr)._M_elems[lVar3]->count != 0x100)) {
        (this->nfull)._M_elems[lVar3] = this->first_nfull;
        this->first_nfull = (short)lVar3;
      }
      if (uVar2 != *(this->arr)._M_elems[lVar3]->Count) {
        this->count = this->count - 1;
      }
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x100);
  return;
}

Assistant:

void LiteScript::_BasicMemory_1::FlagsErase() {
    for (unsigned int i = 0, sz = LITESCRIPT_MEMORY_1_SIZE; i < sz; i++) {
        if (this->arr[i] != nullptr) {
            bool wasFull = this->arr[i]->isFull();
            unsigned int nb = this->arr[i]->Count;
            this->arr[i]->FlagsErase();
            // Si le block n'est plus plein, on le place en premier
            if (wasFull && !this->arr[i]->isFull()) {
                this->nfull[i] = this->first_nfull;
                this->first_nfull = (short)i;
            }
            // Si le nombre d'objet à diminué, on décrémente le compteur
            if (nb != this->arr[i]->Count)
                this->count--;
        }
    }
}